

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_19656::IDLTypeIdentifierVisitor::visit_
          (IDLTypeIdentifierVisitor *this,Container *type)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  first_finderF<const_char_*,_boost::algorithm::is_equal> Finder;
  first_finderF<const_char_*,_boost::algorithm::is_equal> Finder_00;
  iterator_range<const_char_*> FormatResult;
  iterator_range<const_char_*> FormatResult_00;
  int iVar3;
  input_iterator_type InnerIt;
  Type *type_00;
  long *plVar4;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var5;
  long *plVar6;
  string *psVar7;
  const_formatF<boost::iterator_range<const_char_*>_> Formatter;
  const_formatF<boost::iterator_range<const_char_*>_> Formatter_00;
  iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  FindResult;
  iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  FindResult_00;
  string element_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string container_kind;
  undefined1 local_f0 [32];
  long *local_d0;
  char *pcStack_c8;
  long local_c0;
  long lStack_b8;
  long *local_b0;
  char *pcStack_a8;
  long local_a0;
  long lStack_98;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  
  Typelib::Type::getName_abi_cxx11_();
  iVar3 = std::__cxx11::string::compare((char *)&local_70);
  paVar2 = &local_70.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_70.first._M_dataplus._M_p);
  }
  if (iVar3 == 0) {
    std::__cxx11::string::_M_replace
              ((ulong)&this->m_namespace,0,(char *)(this->m_namespace)._M_string_length,0x118426);
    std::__cxx11::string::_M_replace
              ((ulong)&this->m_front,0,(char *)(this->m_front)._M_string_length,0x11818c);
  }
  else {
    type_00 = (Type *)Typelib::Indirect::getIndirection();
    local_f0._0_8_ = local_f0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"");
    getIDLBase(&local_70,type_00,this->m_exporter,(string *)local_f0);
    std::__cxx11::string::operator=((string *)&this->m_namespace,(string *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.second._M_dataplus._M_p != &local_70.second.field_2) {
      operator_delete(local_70.second._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.first._M_dataplus._M_p != paVar2) {
      operator_delete(local_70.first._M_dataplus._M_p);
    }
    if ((anon_unknown_dwarf_19656 *)local_f0._0_8_ != (anon_unknown_dwarf_19656 *)(local_f0 + 0x10))
    {
      operator_delete((void *)local_f0._0_8_);
    }
    if ((this->m_namespace)._M_string_length == 0) {
      local_f0._0_8_ = (anon_unknown_dwarf_19656 *)(local_f0 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"/","");
      getIDLAbsoluteNamespace
                (&local_70.first,(anon_unknown_dwarf_19656 *)local_f0._0_8_,(string *)local_f0._8_8_
                 ,this->m_exporter);
      std::__cxx11::string::operator=((string *)&this->m_namespace,(string *)&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70.first._M_dataplus._M_p != paVar2) {
        operator_delete(local_70.first._M_dataplus._M_p);
      }
      if ((anon_unknown_dwarf_19656 *)local_f0._0_8_ !=
          (anon_unknown_dwarf_19656 *)(local_f0 + 0x10)) {
        operator_delete((void *)local_f0._0_8_);
      }
    }
    Typelib::Container::kind_abi_cxx11_();
    Typelib::getTypename((string *)&local_70);
    if ((anon_unknown_dwarf_19656 *)local_f0._0_8_ != (anon_unknown_dwarf_19656 *)(local_f0 + 0x10))
    {
      operator_delete((void *)local_f0._0_8_);
    }
    Typelib::Indirect::getIndirection();
    Typelib::Type::getName_abi_cxx11_();
    local_b0 = (long *)0x11808a;
    pcStack_a8 = "";
    _Var5._M_current = (char *)local_f0._0_8_;
    for (psVar7 = (string *)local_f0._8_8_; psVar7 != (string *)0x0;
        psVar7 = (string *)((long)&psVar7[-1].field_2 + 0xf)) {
      _Var1._M_current = _Var5._M_current + 1;
      if (*_Var5._M_current == '/') {
        if (_Var5._M_current != _Var1._M_current) {
          local_d0 = (long *)0x118219;
          pcStack_c8 = "";
          Finder.m_Search.
          super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>.
          super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
          super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.
          m_End = "";
          Finder.m_Search.
          super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>.
          super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
          super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.
          m_Begin = "/";
          Finder._16_8_ = local_a0;
          FormatResult.
          super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>.
          super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
          super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.
          m_End = "";
          FormatResult.
          super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>.
          super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
          super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.
          m_Begin = "_";
          Formatter.m_Format.
          super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>.
          super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
          super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.
          m_End = "";
          Formatter.m_Format.
          super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>.
          super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
          super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.
          m_Begin = "_";
          FindResult.
          super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
          .
          super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
          .
          super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
          .m_End._M_current = _Var1._M_current;
          FindResult.
          super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
          .
          super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
          .
          super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
          .m_Begin._M_current = _Var5._M_current;
          boost::algorithm::detail::
          find_format_all_impl2<std::__cxx11::string,boost::algorithm::detail::first_finderF<char_const*,boost::algorithm::is_equal>,boost::algorithm::detail::const_formatF<boost::iterator_range<char_const*>>,boost::iterator_range<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,boost::iterator_range<char_const*>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0,
                     Finder,Formatter,FindResult,FormatResult);
        }
        break;
      }
      _Var5._M_current = _Var1._M_current;
    }
    local_b0 = (long *)0x1180ea;
    pcStack_a8 = "";
    _Var5._M_current = (char *)local_f0._0_8_;
    for (; (string *)local_f0._8_8_ != (string *)0x0;
        local_f0._8_8_ = (long)&((string *)(local_f0._8_8_ + -0x20))->field_2 + 0xf) {
      if (*_Var5._M_current == ' ') {
        local_d0 = (long *)0x118219;
        pcStack_c8 = "";
        Finder_00.m_Search.
        super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>.
        super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
        super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.m_End
             = "";
        Finder_00.m_Search.
        super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>.
        super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
        super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.
        m_Begin = " ";
        Finder_00._16_8_ = local_a0;
        FormatResult_00.
        super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>.
        super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
        super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.m_End
             = "";
        FormatResult_00.
        super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>.
        super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
        super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.
        m_Begin = "_";
        Formatter_00.m_Format.
        super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>.
        super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
        super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.m_End
             = "";
        Formatter_00.m_Format.
        super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>.
        super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
        super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.
        m_Begin = "_";
        FindResult_00.
        super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
        .
        super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
        .
        super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
        .m_End._M_current = _Var5._M_current + 1;
        FindResult_00.
        super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
        .
        super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
        .
        super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
        .m_Begin._M_current = _Var5._M_current;
        boost::algorithm::detail::
        find_format_all_impl2<std::__cxx11::string,boost::algorithm::detail::first_finderF<char_const*,boost::algorithm::is_equal>,boost::algorithm::detail::const_formatF<boost::iterator_range<char_const*>>,boost::iterator_range<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,boost::iterator_range<char_const*>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0,
                   Finder_00,Formatter_00,FindResult_00,FormatResult_00);
        break;
      }
      _Var5._M_current = _Var5._M_current + 1;
    }
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_90,local_70.first._M_dataplus._M_p,
               local_70.first._M_dataplus._M_p + local_70.first._M_string_length);
    std::__cxx11::string::append((char *)local_90);
    plVar4 = (long *)std::__cxx11::string::_M_append((char *)local_90,local_f0._0_8_);
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_c0 = *plVar6;
      lStack_b8 = plVar4[3];
      local_d0 = &local_c0;
    }
    else {
      local_c0 = *plVar6;
      local_d0 = (long *)*plVar4;
    }
    pcStack_c8 = (char *)plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_d0);
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_a0 = *plVar6;
      lStack_98 = plVar4[3];
      local_b0 = &local_a0;
    }
    else {
      local_a0 = *plVar6;
      local_b0 = (long *)*plVar4;
    }
    pcStack_a8 = (char *)plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::operator=((string *)&this->m_front,(string *)&local_b0);
    if (local_b0 != &local_a0) {
      operator_delete(local_b0);
    }
    if (local_d0 != &local_c0) {
      operator_delete(local_d0);
    }
    if (local_90[0] != local_80) {
      operator_delete(local_90[0]);
    }
    if ((anon_unknown_dwarf_19656 *)local_f0._0_8_ != (anon_unknown_dwarf_19656 *)(local_f0 + 0x10))
    {
      operator_delete((void *)local_f0._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.first._M_dataplus._M_p != paVar2) {
      operator_delete(local_70.first._M_dataplus._M_p);
    }
  }
  return true;
}

Assistant:

bool IDLTypeIdentifierVisitor::visit_(Container const& type)
    {
        if (type.getName() == "/std/string")
        {
            m_namespace = "";
            m_front = "string";
        }
        else
        {
            // Get the basename for "kind"
            m_namespace = getIDLBase(type.getIndirection()).first;
            // We generate all containers in orogen::Corba, even if their
            // element type is a builtin
            if (m_namespace.empty())
                m_namespace = getIDLAbsoluteNamespace("/", m_exporter);

            std::string container_kind = Typelib::getTypename(type.kind());
            std::string element_name   = type.getIndirection().getName();
            boost::replace_all(element_name, Typelib::NamespaceMarkString, "_");
            boost::replace_all(element_name, " ", "_");
            m_front = container_kind + "_" + element_name + "_";
        }

        return true;
    }